

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall Omega_h::metric_from_gradients_dim<1>(Omega_h *this,Reals *gradients,Real eps)

{
  int *piVar1;
  Alloc *pAVar2;
  undefined8 uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar4;
  LO size_in;
  size_t sVar5;
  Reals RVar6;
  Write<double> out;
  type f;
  Write<double> local_78;
  undefined1 local_60 [32];
  void *local_40;
  Write<double> local_38;
  Real local_28;
  
  pAVar2 = (gradients->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar5 = pAVar2->size;
  }
  else {
    sVar5 = (ulong)pAVar2 >> 3;
  }
  local_60._0_8_ = local_60 + 0x10;
  local_28 = eps;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
  size_in = (LO)(sVar5 >> 3);
  Write<double>::Write(&local_78,size_in,(string *)local_60);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  local_60._0_8_ = (gradients->write_).shared_alloc_.alloc;
  if ((local_60._0_8_ & 7) == 0 && (Alloc *)local_60._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60._0_8_ = ((Alloc *)local_60._0_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_60._0_8_)->use_count = ((Alloc *)local_60._0_8_)->use_count + 1;
    }
  }
  local_60._8_8_ = (gradients->write_).shared_alloc_.direct_ptr;
  local_60._16_8_ = local_28;
  local_60._24_8_ = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_60._24_8_ = (local_78.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40 = local_78.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::metric_from_gradients_dim<1>(Omega_h::Read<double>,double)::_lambda(int)_1_>
            (size_in,(type *)local_60,"metric_from_gradients");
  local_38.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
  local_38.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
  if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
       local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
    local_38.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_78.shared_alloc_.alloc = (Alloc *)0x0;
  local_78.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_38);
  pAVar2 = local_38.shared_alloc_.alloc;
  pvVar4 = extraout_RDX;
  if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 && local_38.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  uVar3 = local_60._24_8_;
  if ((local_60._24_8_ & 7) == 0 && (Alloc *)local_60._24_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_60._24_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_60._24_8_);
      operator_delete((void *)uVar3,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  uVar3 = local_60._0_8_;
  if ((local_60._0_8_ & 7) == 0 && (Alloc *)local_60._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_60._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_60._0_8_);
      operator_delete((void *)uVar3,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  pAVar2 = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals metric_from_gradients_dim(Reals gradients, Real eps) {
  auto n = divide_no_remainder(gradients.size(), dim);
  auto out = Write<Real>(n * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO const i) {
    auto const grad = get_vector<dim>(gradients, i);
    auto const m = metric_from_gradient(grad, eps);
    set_symm(out, i, m);
  };
  parallel_for(n, f, "metric_from_gradients");
  return out;
}